

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

int64_t dist_block_px_domain
                  (AV1_COMP *cpi,MACROBLOCK *x,int plane,BLOCK_SIZE plane_bsize,int block,
                  int blk_row,int blk_col,TX_SIZE tx_size)

{
  uint8_t uVar1;
  uint8_t uVar2;
  int iVar3;
  PLANE_TYPE plane_type_00;
  TX_TYPE TVar4;
  int iVar5;
  uint uVar6;
  MACROBLOCKD *xd_00;
  uint8_t *puVar7;
  int in_EDX;
  long in_RSI;
  int in_R9D;
  int in_stack_00000008;
  byte in_stack_00000010;
  TX_TYPE tx_type;
  PLANE_TYPE plane_type;
  uint16_t recon16 [4096];
  uint8_t *recon;
  tran_low_t *dqcoeff;
  uint8_t *dst;
  uint8_t *src;
  int dst_idx;
  int src_idx;
  int dst_stride;
  int src_stride;
  int bsh;
  int bsw;
  BLOCK_SIZE tx_bsize;
  uint16_t eob;
  macroblock_plane *p;
  MACROBLOCKD *xd;
  int in_stack_ffffffffffffdf74;
  undefined4 in_stack_ffffffffffffdf78;
  int in_stack_ffffffffffffdf7c;
  int in_stack_ffffffffffffdf80;
  undefined4 in_stack_ffffffffffffdf84;
  undefined4 uVar8;
  MACROBLOCKD *in_stack_ffffffffffffdf88;
  MACROBLOCKD *in_stack_ffffffffffffdf90;
  uint8_t *in_stack_ffffffffffffdf98;
  int in_stack_ffffffffffffdfa0;
  int in_stack_ffffffffffffdfa4;
  int in_stack_ffffffffffffdfa8;
  undefined4 in_stack_ffffffffffffdfac;
  int in_stack_ffffffffffffdfb0;
  int in_stack_ffffffffffffdfb4;
  MACROBLOCK *in_stack_ffffffffffffdfb8;
  AV1_COMP *in_stack_ffffffffffffdfc0;
  int in_stack_ffffffffffffdfe0;
  int in_stack_ffffffffffffdfe8;
  int in_stack_ffffffffffffdff0;
  BLOCK_SIZE in_stack_ffffffffffffdff8;
  BLOCK_SIZE in_stack_ffffffffffffe000;
  
  xd_00 = (MACROBLOCKD *)(in_RSI + 0x1a0);
  uVar1 = block_size_wide[txsize_to_bsize[in_stack_00000010]];
  uVar2 = block_size_high[txsize_to_bsize[in_stack_00000010]];
  iVar3 = xd_00->plane[in_EDX].dst.stride;
  puVar7 = xd_00->plane[in_EDX].dst.buf + (in_R9D * iVar3 + in_stack_00000008) * 4;
  iVar5 = is_cur_buf_hbd(xd_00);
  if (iVar5 == 0) {
    (*aom_convolve_copy)(puVar7,(long)iVar3,&stack0xffffffffffffdf88,0x40,(int)uVar1,(int)uVar2);
  }
  else {
    (*aom_highbd_convolve_copy)
              ((uint16_t *)((long)puVar7 * 2),(long)iVar3,(uint16_t *)&stack0xffffffffffffdf88,0x40,
               (int)uVar1,(int)uVar2);
  }
  plane_type_00 = get_plane_type(in_EDX);
  uVar8 = CONCAT13(plane_type_00,(int3)in_stack_ffffffffffffdf84);
  TVar4 = av1_get_tx_type(in_stack_ffffffffffffdf88,plane_type_00,in_stack_ffffffffffffdf80,
                          in_stack_ffffffffffffdf7c,
                          (TX_SIZE)((uint)in_stack_ffffffffffffdf78 >> 0x18),
                          in_stack_ffffffffffffdf74);
  av1_inverse_transform_block
            (in_stack_ffffffffffffdf90,&in_stack_ffffffffffffdf88->mi_row,
             CONCAT13((char)((uint)uVar8 >> 0x18),CONCAT12(TVar4,(short)uVar8)),
             (TX_TYPE)((uint)in_stack_ffffffffffffdf80 >> 0x18),
             (TX_SIZE)((uint)in_stack_ffffffffffffdf80 >> 0x10),
             (uint8_t *)CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
             in_stack_ffffffffffffdfa0,in_stack_ffffffffffffdfa8,in_stack_ffffffffffffdfb0);
  uVar6 = pixel_dist(in_stack_ffffffffffffdfc0,in_stack_ffffffffffffdfb8,in_stack_ffffffffffffdfb4,
                     (uint8_t *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8),
                     in_stack_ffffffffffffdfa4,in_stack_ffffffffffffdf98,in_stack_ffffffffffffdfe0,
                     in_stack_ffffffffffffdfe8,in_stack_ffffffffffffdff0,in_stack_ffffffffffffdff8,
                     in_stack_ffffffffffffe000);
  return (ulong)(uVar6 << 4);
}

Assistant:

static inline int64_t dist_block_px_domain(const AV1_COMP *cpi, MACROBLOCK *x,
                                           int plane, BLOCK_SIZE plane_bsize,
                                           int block, int blk_row, int blk_col,
                                           TX_SIZE tx_size) {
  MACROBLOCKD *const xd = &x->e_mbd;
  const struct macroblock_plane *const p = &x->plane[plane];
  const uint16_t eob = p->eobs[block];
  const BLOCK_SIZE tx_bsize = txsize_to_bsize[tx_size];
  const int bsw = block_size_wide[tx_bsize];
  const int bsh = block_size_high[tx_bsize];
  const int src_stride = x->plane[plane].src.stride;
  const int dst_stride = xd->plane[plane].dst.stride;
  // Scale the transform block index to pixel unit.
  const int src_idx = (blk_row * src_stride + blk_col) << MI_SIZE_LOG2;
  const int dst_idx = (blk_row * dst_stride + blk_col) << MI_SIZE_LOG2;
  const uint8_t *src = &x->plane[plane].src.buf[src_idx];
  const uint8_t *dst = &xd->plane[plane].dst.buf[dst_idx];
  const tran_low_t *dqcoeff = p->dqcoeff + BLOCK_OFFSET(block);

  assert(cpi != NULL);
  assert(tx_size_wide_log2[0] == tx_size_high_log2[0]);

  uint8_t *recon;
  DECLARE_ALIGNED(16, uint16_t, recon16[MAX_TX_SQUARE]);

#if CONFIG_AV1_HIGHBITDEPTH
  if (is_cur_buf_hbd(xd)) {
    recon = CONVERT_TO_BYTEPTR(recon16);
    aom_highbd_convolve_copy(CONVERT_TO_SHORTPTR(dst), dst_stride,
                             CONVERT_TO_SHORTPTR(recon), MAX_TX_SIZE, bsw, bsh);
  } else {
    recon = (uint8_t *)recon16;
    aom_convolve_copy(dst, dst_stride, recon, MAX_TX_SIZE, bsw, bsh);
  }
#else
  recon = (uint8_t *)recon16;
  aom_convolve_copy(dst, dst_stride, recon, MAX_TX_SIZE, bsw, bsh);
#endif

  const PLANE_TYPE plane_type = get_plane_type(plane);
  TX_TYPE tx_type = av1_get_tx_type(xd, plane_type, blk_row, blk_col, tx_size,
                                    cpi->common.features.reduced_tx_set_used);
  av1_inverse_transform_block(xd, dqcoeff, plane, tx_type, tx_size, recon,
                              MAX_TX_SIZE, eob,
                              cpi->common.features.reduced_tx_set_used);

  return 16 * pixel_dist(cpi, x, plane, src, src_stride, recon, MAX_TX_SIZE,
                         blk_row, blk_col, plane_bsize, tx_bsize);
}